

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O0

bool __thiscall DTreePropagator::propagateNewNode(DTreePropagator *this,int n)

{
  bool bVar1;
  iterator this_00;
  uint *puVar2;
  int in_ESI;
  DReachabilityPropagator *in_RDI;
  int i_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  int i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  reference local_68;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  reference local_40;
  uint local_34;
  int *local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  reference local_20;
  int local_14;
  bool local_1;
  
  local_14 = in_ESI;
  bVar1 = DReachabilityPropagator::propagateNewNode(in_RDI,in_ESI);
  if (bVar1) {
    local_20 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&in_RDI->in,(long)local_14);
    local_28._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    local_30 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI
                         ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_ffffffffffffff88);
      if (!bVar1) break;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_28);
      local_34 = *puVar2;
      (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x19])
                (in_RDI,(ulong)local_34);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_28);
    }
    local_40 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&in_RDI->ou,(long)local_14);
    local_48._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI
                         ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_ffffffffffffff88);
      if (!bVar1) break;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_48);
      in_stack_ffffffffffffffac = *puVar2;
      (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x19])
                (in_RDI,(ulong)in_stack_ffffffffffffffac);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_48);
    }
    local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)this_00._M_current,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::_Bit_reference::operator=(&local_68,true);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DTreePropagator::propagateNewNode(int n) {
	if (!DReachabilityPropagator::propagateNewNode(n)) {
		return false;
	}

	for (const int i : in[n]) {
		prevent_cycle(i);
	}
	for (const int i : ou[n]) {
		prevent_cycle(i);
	}

	processed_n[n] = true;

	return true;
}